

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLib.h
# Opt level: O1

float Scl_LibLookup(SC_Surface *p,float slew,float load)

{
  long lVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  float *pfVar5;
  float *pfVar6;
  void **ppvVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  float fVar15;
  float fVar16;
  
  iVar3 = (p->vIndex0).nSize;
  if ((iVar3 == 1) && ((p->vIndex1).nSize == 1)) {
    iVar3 = (p->vData).nSize;
    if (iVar3 < 1) {
LAB_004781ea:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if (iVar3 != 1) {
      __assert_fail("Vec_PtrSize(&p->vData) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                    ,0x1e9,"float Scl_LibLookup(SC_Surface *, float, float)");
    }
    pvVar4 = *(p->vData).pArray;
    if (*(int *)((long)pvVar4 + 4) != 1) {
      __assert_fail("Vec_FltSize(vTemp) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLib.h"
                    ,0x1ea,"float Scl_LibLookup(SC_Surface *, float, float)");
    }
    fVar16 = **(float **)((long)pvVar4 + 8);
  }
  else {
    pfVar5 = (p->vIndex0).pArray;
    uVar13 = 1;
    uVar12 = 1;
    if (2 < iVar3) {
      uVar12 = 1;
      do {
        if (slew < pfVar5[uVar12]) goto LAB_00478117;
        uVar12 = uVar12 + 1;
      } while (iVar3 - 1U != uVar12);
      uVar12 = (ulong)(iVar3 - 1U);
    }
LAB_00478117:
    pfVar6 = (p->vIndex1).pArray;
    iVar3 = (p->vIndex1).nSize;
    if (2 < iVar3) {
      uVar14 = iVar3 - 1;
      uVar13 = 1;
      do {
        if (load < pfVar6[uVar13]) goto LAB_00478145;
        uVar13 = uVar13 + 1;
      } while (uVar14 != uVar13);
      uVar13 = (ulong)uVar14;
    }
LAB_00478145:
    iVar10 = (int)uVar12;
    lVar1 = (long)(int)uVar13 + -1;
    iVar3 = (p->vData).nSize;
    if ((iVar3 < iVar10) || (iVar3 <= iVar10)) goto LAB_004781ea;
    uVar11 = uVar13 & 0xffffffff;
    fVar15 = (load - pfVar6[(long)(int)uVar13 + -1]) /
             (pfVar6[uVar11] - pfVar6[(long)(int)uVar13 + -1]);
    ppvVar7 = (p->vData).pArray;
    lVar8 = *(long *)((long)ppvVar7[iVar10 - 1U] + 8);
    lVar9 = *(long *)((long)ppvVar7[uVar12 & 0xffffffff] + 8);
    fVar16 = *(float *)(lVar8 + lVar1 * 4);
    fVar16 = (*(float *)(lVar8 + uVar11 * 4) - fVar16) * fVar15 + fVar16;
    fVar2 = *(float *)(lVar9 + lVar1 * 4);
    fVar16 = (((*(float *)(lVar9 + uVar11 * 4) - fVar2) * fVar15 + fVar2) - fVar16) *
             ((slew - pfVar5[(int)(iVar10 - 1U)]) /
             (pfVar5[uVar12 & 0xffffffff] - pfVar5[(int)(iVar10 - 1U)])) + fVar16;
  }
  return fVar16;
}

Assistant:

static inline float Scl_LibLookup( SC_Surface * p, float slew, float load )
{
    float * pIndex0, * pIndex1, * pDataS, * pDataS1;
    float sfrac, lfrac, p0, p1;
    int s, l;

    // handle constant table
    if ( Vec_FltSize(&p->vIndex0) == 1 && Vec_FltSize(&p->vIndex1) == 1 )
    {
        Vec_Flt_t * vTemp = (Vec_Flt_t *)Vec_PtrEntry(&p->vData, 0);
        assert( Vec_PtrSize(&p->vData) == 1 );
        assert( Vec_FltSize(vTemp) == 1 );
        return Vec_FltEntry(vTemp, 0);
    }

    // Find closest sample points in surface:
    pIndex0 = Vec_FltArray(&p->vIndex0);
    for ( s = 1; s < Vec_FltSize(&p->vIndex0)-1; s++ )
        if ( pIndex0[s] > slew )
            break;
    s--;

    pIndex1 = Vec_FltArray(&p->vIndex1);
    for ( l = 1; l < Vec_FltSize(&p->vIndex1)-1; l++ )
        if ( pIndex1[l] > load )
            break;
    l--;

    // Interpolate (or extrapolate) function value from sample points:
    sfrac = (slew - pIndex0[s]) / (pIndex0[s+1] - pIndex0[s]);
    lfrac = (load - pIndex1[l]) / (pIndex1[l+1] - pIndex1[l]);

    pDataS  = Vec_FltArray( (Vec_Flt_t *)Vec_PtrEntry(&p->vData, s) );
    pDataS1 = Vec_FltArray( (Vec_Flt_t *)Vec_PtrEntry(&p->vData, s+1) );

    p0 = pDataS [l] + lfrac * (pDataS [l+1] - pDataS [l]);
    p1 = pDataS1[l] + lfrac * (pDataS1[l+1] - pDataS1[l]);

    return p0 + sfrac * (p1 - p0);      // <<== multiply result with K factor here 
}